

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::downresV(PtexSeparableKernel *this)

{
  int8_t *piVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  
  pfVar3 = this->kv;
  uVar2 = this->v;
  uVar4 = uVar2 & 1;
  uVar6 = this->vw - uVar4;
  pfVar7 = pfVar3 + uVar4;
  pfVar8 = pfVar7;
  for (uVar5 = (long)(int)uVar6 / 2 & 0xffffffff; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
    *pfVar7 = *pfVar8 + pfVar8[1];
    pfVar7 = pfVar7 + 1;
    pfVar8 = pfVar8 + 2;
  }
  if ((uVar6 & 1) != 0) {
    *pfVar7 = *pfVar8;
    pfVar7 = pfVar7 + 1;
  }
  this->v = (int)uVar2 / 2;
  this->vw = (int)((ulong)((long)pfVar7 - (long)pfVar3) >> 2);
  piVar1 = &(this->res).vlog2;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void downresV()
    {
        float* src = kv;
        float* dst = kv;

        // skip odd leading sample (if any)
        if (v & 1) {
            dst++;
            src++;
            vw--;
        }

        // combine even pairs
        for (int i = vw/2; i > 0; i--) {
            *dst++ = src[0] + src[1];
            src += 2;
        }

        // copy odd trailing sample (if any)
        if (vw & 1) {
            *dst++ = *src++;
        }

        // update state
        v /= 2;
        vw = int(dst - kv);
        res.vlog2--;
    }